

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

void api_fixed_suite::fixed_remove_front(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  iterator second_begin;
  iterator second_end;
  iterator first_begin;
  iterator first_end;
  allocator<int> local_81;
  int local_80 [2];
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> expect;
  undefined1 local_30 [8];
  circular_view<int,_4UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_4UL>::circular_view<4UL,_0>
            ((circular_view<int,_4UL> *)local_30,(value_type (*) [4])&span.member.next);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0xb;
  input._M_len = 3;
  input._M_array =
       (iterator)
       ((long)&expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage + 4);
  vista::circular_view<int,_4UL>::operator=((circular_view<int,_4UL> *)local_30,input);
  vista::circular_view<int,_4UL>::remove_front((circular_view<int,_4UL> *)local_30,1);
  local_80[0] = 0x16;
  local_80[1] = 0x21;
  local_78 = local_80;
  local_70 = 2;
  std::allocator<int>::allocator(&local_81);
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__l,&local_81);
  std::allocator<int>::~allocator(&local_81);
  first_begin = vista::circular_view<int,_4UL>::begin((circular_view<int,_4UL> *)local_30);
  first_end = vista::circular_view<int,_4UL>::end((circular_view<int,_4UL> *)local_30);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_68);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_68);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,4ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x42c,"void api_fixed_suite::fixed_remove_front()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_68);
  return;
}

Assistant:

void fixed_remove_front()
{
    int array[4] = {};
    circular_view<int, 4> span(array);
    span = { 11, 22, 33 };
    span.remove_front();
    {
        std::vector<int> expect = { 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}